

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O1

void dumpFunction(DumpState *D,Proto *f,TString *psource)

{
  TValue *pTVar1;
  int iVar2;
  ulong in_RAX;
  uint uVar3;
  byte bVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  lu_byte x;
  ulong local_38;
  
  local_38 = in_RAX;
  if ((D->strip == 0) && (f->source != psource)) {
    dumpString(D,f->source);
  }
  else {
    dumpSize(D,0);
  }
  dumpSize(D,(long)f->linedefined);
  dumpSize(D,(long)f->lastlinedefined);
  if (D->status == 0) {
    local_38._0_1_ = f->numparams;
    iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
    D->status = iVar2;
  }
  local_38._0_1_ = f->is_vararg;
  if (D->status == 0) {
    iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
    D->status = iVar2;
  }
  local_38 = CONCAT71(local_38._1_7_,f->maxstacksize);
  if (D->status == 0) {
    iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
    D->status = iVar2;
  }
  dumpSize(D,(long)f->sizecode);
  if (((long)f->sizecode != 0) && (D->status == 0)) {
    iVar2 = (*D->writer)(D->L,f->code,(long)f->sizecode << 2,D->data);
    D->status = iVar2;
  }
  sVar8 = (size_t)f->sizek;
  dumpSize(D,sVar8);
  if (0 < (long)sVar8) {
    lVar7 = 0;
    do {
      pTVar1 = f->k;
      bVar4 = (&pTVar1->tt_)[lVar7] & 0x3f;
      local_38 = CONCAT71(local_38._1_7_,(&pTVar1->tt_)[lVar7]) & 0xffffffffffffff3f;
      if (D->status == 0) {
        iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
        D->status = iVar2;
      }
      if (bVar4 < 0x13) {
        if (bVar4 == 3) {
          local_38 = *(ulong *)((long)&pTVar1->value_ + lVar7);
LAB_0010ae49:
          if (D->status == 0) {
            iVar2 = (*D->writer)(D->L,&local_38,8,D->data);
            D->status = iVar2;
          }
        }
        else if (bVar4 == 4) goto LAB_0010ae31;
      }
      else {
        if (bVar4 != 0x14) {
          if (bVar4 != 0x13) goto LAB_0010ae67;
          local_38 = *(ulong *)((long)&pTVar1->value_ + lVar7);
          goto LAB_0010ae49;
        }
LAB_0010ae31:
        dumpString(D,*(TString **)((long)&pTVar1->value_ + lVar7));
      }
LAB_0010ae67:
      lVar7 = lVar7 + 0x10;
    } while (sVar8 * 0x10 != lVar7);
  }
  sVar8 = (size_t)f->sizeupvalues;
  dumpSize(D,sVar8);
  if (0 < (long)sVar8) {
    lVar7 = 0;
    do {
      if (D->status == 0) {
        local_38._0_1_ = (&f->upvalues->instack)[lVar7];
        iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
        D->status = iVar2;
      }
      local_38._0_1_ = (&f->upvalues->idx)[lVar7];
      if (D->status == 0) {
        iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
        D->status = iVar2;
      }
      local_38 = CONCAT71(local_38._1_7_,(&f->upvalues->kind)[lVar7]);
      if (D->status == 0) {
        iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
        D->status = iVar2;
      }
      lVar7 = lVar7 + 0x10;
    } while (sVar8 * 0x10 != lVar7);
  }
  sVar8 = (size_t)f->sizep;
  dumpSize(D,sVar8);
  if (0 < (long)sVar8) {
    sVar5 = 0;
    do {
      dumpFunction(D,f->p[sVar5],f->source);
      sVar5 = sVar5 + 1;
    } while (sVar8 != sVar5);
  }
  if (D->strip == 0) {
    sVar8 = (size_t)f->sizelineinfo;
  }
  else {
    sVar8 = 0;
  }
  dumpSize(D,sVar8);
  if ((sVar8 != 0) && (D->status == 0)) {
    iVar2 = (*D->writer)(D->L,f->lineinfo,sVar8,D->data);
    D->status = iVar2;
  }
  uVar3 = 0;
  if (D->strip == 0) {
    uVar3 = f->sizeabslineinfo;
  }
  dumpSize(D,(long)(int)uVar3);
  if (0 < (int)uVar3) {
    uVar6 = 0;
    do {
      dumpSize(D,(long)f->abslineinfo[uVar6].pc);
      dumpSize(D,(long)f->abslineinfo[uVar6].line);
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
  }
  uVar3 = 0;
  if (D->strip == 0) {
    uVar3 = f->sizelocvars;
  }
  dumpSize(D,(long)(int)uVar3);
  if (0 < (int)uVar3) {
    lVar7 = 0;
    do {
      dumpString(D,*(TString **)((long)&f->locvars->varname + lVar7));
      dumpSize(D,(long)*(int *)((long)&f->locvars->startpc + lVar7));
      dumpSize(D,(long)*(int *)((long)&f->locvars->endpc + lVar7));
      lVar7 = lVar7 + 0x10;
    } while ((ulong)uVar3 << 4 != lVar7);
  }
  uVar3 = 0;
  if (D->strip == 0) {
    uVar3 = f->sizeupvalues;
  }
  dumpSize(D,(long)(int)uVar3);
  if (0 < (int)uVar3) {
    lVar7 = 0;
    do {
      dumpString(D,*(TString **)((long)&f->upvalues->name + lVar7));
      lVar7 = lVar7 + 0x10;
    } while ((ulong)uVar3 << 4 != lVar7);
  }
  return;
}

Assistant:

static void dumpFunction (DumpState *D, const Proto *f, TString *psource) {
  if (D->strip || f->source == psource)
    dumpString(D, NULL);  /* no debug info or same source as its parent */
  else
    dumpString(D, f->source);
  dumpInt(D, f->linedefined);
  dumpInt(D, f->lastlinedefined);
  dumpByte(D, f->numparams);
  dumpByte(D, f->is_vararg);
  dumpByte(D, f->maxstacksize);
  dumpCode(D, f);
  dumpConstants(D, f);
  dumpUpvalues(D, f);
  dumpProtos(D, f);
  dumpDebug(D, f);
}